

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall despot::Solver::BeliefUpdate(Solver *this,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  log_ostream *plVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = get_time_second();
  (*this->belief_->_vptr_Belief[3])(this->belief_,action,obs);
  History::Add(&this->history_,action,obs);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar2 = logging::stream(3);
      poVar3 = std::operator<<(&plVar2->super_ostream,
                               "[Solver::Update] Updated belief, history and root with action ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,action);
      poVar3 = std::operator<<(poVar3,", observation ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," in ");
      dVar5 = get_time_second();
      poVar3 = std::ostream::_M_insert<double>(dVar5 - dVar4);
      poVar3 = std::operator<<(poVar3,"s");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
  }
  return;
}

Assistant:

void Solver::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	double start = get_time_second();

	belief_->Update(action, obs);
	history_.Add(action, obs);

	logi << "[Solver::Update] Updated belief, history and root with action "
		<< action << ", observation " << obs
		<< " in " << (get_time_second() - start) << "s" << endl;
}